

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
* __thiscall
testing::internal::
TypedExpectation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::GetCurrentAction(TypedExpectation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                   *this,FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                         *mocker,ArgumentTuple *args)

{
  int iVar1;
  ostream *poVar2;
  TypedExpectation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *pTVar3;
  char *pcVar4;
  int iVar5;
  string sStack_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  iVar1 = ExpectationBase::call_count((ExpectationBase *)this);
  std::__cxx11::string::string
            ((string *)&ss,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
             (allocator *)&sStack_1d8);
  Assert(0 < iVar1,
         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-spec-builders.h"
         ,0x48e,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  iVar5 = (int)((ulong)(*(long *)(this + 0x90) - *(long *)(this + 0x88)) >> 3);
  if (((0 < iVar5) && (iVar5 < iVar1)) &&
     (this[0xa1] ==
      (TypedExpectation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
       )0x0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    ExpectationBase::DescribeLocationTo((ExpectationBase *)this,local_1a8);
    poVar2 = std::operator<<(local_1a8,"Actions ran out in ");
    poVar2 = std::operator<<(poVar2,*(char **)(this + 0x18));
    poVar2 = std::operator<<(poVar2,"...\n");
    poVar2 = std::operator<<(poVar2,"Called ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," times, but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
    poVar2 = std::operator<<(poVar2," WillOnce()");
    pcVar4 = "s are";
    if (iVar5 == 1) {
      pcVar4 = " is";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2," specified - ");
    FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::DescribeDefaultActionTo(mocker,args,local_1a8);
    std::__cxx11::stringbuf::str();
    Log(kWarning,&sStack_1d8,1);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  if (iVar5 < iVar1) {
    pTVar3 = this + 0x120;
  }
  else {
    pTVar3 = *(TypedExpectation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
               **)(*(long *)(this + 0x88) + -8 + (long)iVar1 * 8);
  }
  return (Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          *)pTVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count
               ? *static_cast<const Action<F>*>(
                     untyped_actions_[static_cast<size_t>(count - 1)])
               : repeated_action();
  }